

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,LargestInt value)

{
  ulong uVar1;
  byte *pbVar2;
  bool bVar3;
  UIntToStringBuffer buffer;
  allocator<char> local_29;
  byte local_28 [22];
  byte abStack_12 [10];
  
  if (this == (Json *)0x8000000000000000) {
    pbVar2 = abStack_12 + 3;
    uVar1 = 0x8000000000000000;
    do {
      pbVar2[-2] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
      pbVar2 = pbVar2 + -1;
      bVar3 = 9 < uVar1;
      uVar1 = uVar1 / 10;
    } while (bVar3);
  }
  else {
    if (-1 < (long)this) {
      pbVar2 = abStack_12 + 2;
      abStack_12[2] = 0;
      do {
        pbVar2[-1] = (char)this + (char)(Json *)((ulong)this / 10) * -10 | 0x30;
        pbVar2 = pbVar2 + -1;
        bVar3 = (Json *)0x9 < this;
        this = (Json *)((ulong)this / 10);
      } while (bVar3);
      goto LAB_0048ec25;
    }
    pbVar2 = abStack_12 + 3;
    uVar1 = -(long)this;
    do {
      pbVar2[-2] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
      pbVar2 = pbVar2 + -1;
      bVar3 = 9 < uVar1;
      uVar1 = uVar1 / 10;
    } while (bVar3);
  }
  abStack_12[2] = 0;
  pbVar2[-2] = 0x2d;
  pbVar2 = pbVar2 + -2;
LAB_0048ec25:
  if (pbVar2 < local_28) {
    __assert_fail("current >= buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                  ,0x94,"std::string Json::valueToString(LargestInt)");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)pbVar2,&local_29);
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING valueToString(LargestInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  if (value == Value::minLargestInt) {
    uintToString(LargestUInt(Value::maxLargestInt) + 1, current);
    *--current = '-';
  } else if (value < 0) {
    uintToString(LargestUInt(-value), current);
    *--current = '-';
  } else {
    uintToString(LargestUInt(value), current);
  }
  assert(current >= buffer);
  return current;
}